

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O0

string_type * __thiscall
booster::locale::impl_icu::icu_std_converter<wchar_t,4>::std_abi_cxx11_
          (icu_std_converter<wchar_t,_4> *this,UnicodeString *str)

{
  undefined4 uVar1;
  int32_t iVar2;
  UnicodeString *this_00;
  char16_t *pcVar3;
  UnicodeString *in_RDX;
  string_type *in_RDI;
  UErrorCode code;
  int32_t len;
  UChar32 *ptr;
  string_type *tmp;
  UnicodeString *in_stack_ffffffffffffff80;
  undefined4 local_40;
  undefined4 local_3c;
  UnicodeString *local_38;
  undefined1 local_19;
  UnicodeString *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::__cxx11::wstring::wstring((wstring *)in_RDI);
  icu_70::UnicodeString::length(in_stack_ffffffffffffff80);
  std::__cxx11::wstring::resize((ulong)in_RDI);
  this_00 = (UnicodeString *)std::__cxx11::wstring::operator[]((ulong)in_RDI);
  local_3c = 0;
  local_40 = 0;
  local_38 = this_00;
  uVar1 = std::__cxx11::wstring::size();
  pcVar3 = icu_70::UnicodeString::getBuffer(local_18);
  iVar2 = icu_70::UnicodeString::length(this_00);
  u_strToUTF32_70(this_00,uVar1,&local_3c,pcVar3,iVar2,&local_40);
  check_and_throw_icu_error(U_ZERO_ERROR);
  std::__cxx11::wstring::resize((ulong)in_RDI);
  return in_RDI;
}

Assistant:

string_type std(icu::UnicodeString const &str) const
        {
            string_type tmp;
            tmp.resize(str.length());
            UChar32 *ptr=reinterpret_cast<UChar32 *>(&tmp[0]);

            #ifdef __SUNPRO_CC
            int len=0;
            #else
            ::int32_t len=0;
            #endif

            UErrorCode code=U_ZERO_ERROR;
            u_strToUTF32(ptr,tmp.size(),&len,str.getBuffer(),str.length(),&code);

            check_and_throw_icu_error(code);

            tmp.resize(len);

            return tmp;
        }